

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decompiler.cpp
# Opt level: O2

uint64_t __thiscall r_comp::Decompiler::decompile_references(Decompiler *this,Image *image)

{
  unordered_map<unsigned_short,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<unsigned_short>,_std::equal_to<unsigned_short>,_std::allocator<std::pair<const_unsigned_short,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *this_00;
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_short,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_short>_>_>
  *this_01;
  SysObject *__k;
  SysObject *pSVar1;
  Metadata *this_02;
  ushort uVar2;
  mapped_type *pmVar3;
  SysObject **ppSVar4;
  iterator iVar5;
  mapped_type *pmVar6;
  mapped_type *pmVar7;
  __node_base *p_Var8;
  ulong uVar9;
  Class *c;
  string name;
  unordered_map<const_r_comp::Class_*,_unsigned_short,_std::hash<const_r_comp::Class_*>,_std::equal_to<const_r_comp::Class_*>,_std::allocator<std::pair<const_r_comp::Class_*const,_unsigned_short>_>_>
  object_ID_per_class;
  ushort local_d2;
  Decompiler *local_d0;
  Class *local_c8;
  _Insert<unsigned_short,_unsigned_short,_std::allocator<unsigned_short>,_std::__detail::_Identity,_std::equal_to<unsigned_short>,_std::hash<unsigned_short>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>,_true>
  *local_c0;
  _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  *local_b8;
  CodeSegment *local_b0;
  undefined1 local_a8 [32];
  string local_88;
  _Hashtable<const_r_comp::Class_*,_std::pair<const_r_comp::Class_*const,_unsigned_short>,_std::allocator<std::pair<const_r_comp::Class_*const,_unsigned_short>_>,_std::__detail::_Select1st,_std::equal_to<const_r_comp::Class_*>,_std::hash<const_r_comp::Class_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  local_68;
  
  local_68._M_buckets = &local_68._M_single_bucket;
  local_68._M_bucket_count = 1;
  local_68._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  local_68._M_element_count = 0;
  local_68._M_rehash_policy._M_max_load_factor = 1.0;
  local_68._M_rehash_policy._M_next_resize = 0;
  local_68._M_single_bucket = (__node_base_ptr)0x0;
  p_Var8 = &(this->metadata->sys_classes)._M_h._M_before_begin;
  local_d0 = this;
  while (p_Var8 = p_Var8->_M_nxt, p_Var8 != (__node_base *)0x0) {
    local_a8._0_8_ = p_Var8 + 5;
    pmVar3 = std::__detail::
             _Map_base<const_r_comp::Class_*,_std::pair<const_r_comp::Class_*const,_unsigned_short>,_std::allocator<std::pair<const_r_comp::Class_*const,_unsigned_short>_>,_std::__detail::_Select1st,_std::equal_to<const_r_comp::Class_*>,_std::hash<const_r_comp::Class_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
             ::operator[]((_Map_base<const_r_comp::Class_*,_std::pair<const_r_comp::Class_*const,_unsigned_short>,_std::allocator<std::pair<const_r_comp::Class_*const,_unsigned_short>_>,_std::__detail::_Select1st,_std::equal_to<const_r_comp::Class_*>,_std::hash<const_r_comp::Class_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                           *)&local_68,(key_type *)local_a8);
    *pmVar3 = 0;
  }
  local_a8._0_8_ = local_a8 + 0x10;
  local_a8._8_8_ = 0;
  local_a8[0x10] = '\0';
  local_d0->image = image;
  local_b0 = &image->code_segment;
  local_b8 = (_Hashtable<unsigned_int,_std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
              *)&image->object_names;
  local_c0 = (_Insert<unsigned_short,_unsigned_short,_std::allocator<unsigned_short>,_std::__detail::_Identity,_std::equal_to<unsigned_short>,_std::hash<unsigned_short>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>,_true>
              *)&local_d0->named_objects;
  this_00 = &local_d0->object_names;
  this_01 = &local_d0->object_indices;
  local_d2 = 0;
  while( true ) {
    uVar9 = (long)(image->code_segment).objects.m_vector.
                  super__Vector_base<r_code::SysObject_*,_std::allocator<r_code::SysObject_*>_>.
                  _M_impl.super__Vector_impl_data._M_finish -
            (long)(image->code_segment).objects.m_vector.
                  super__Vector_base<r_code::SysObject_*,_std::allocator<r_code::SysObject_*>_>.
                  _M_impl.super__Vector_impl_data._M_start >> 3;
    if (uVar9 <= local_d2) break;
    ppSVar4 = r_code::vector<r_code::SysObject_*>::operator[](&local_b0->objects,(ulong)local_d2);
    pSVar1 = *ppSVar4;
    __k = pSVar1 + 0x68;
    iVar5 = std::
            _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
            ::find(local_b8,(key_type_conflict *)__k);
    if (iVar5.
        super__Node_iterator_base<std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_false>
        ._M_cur == (__node_type *)0x0) {
      this_02 = local_d0->metadata;
      r_code::vector<r_code::Atom>::operator[]((vector<r_code::Atom> *)(pSVar1 + 8),0);
      uVar2 = r_code::Atom::asOpcode();
      local_c8 = Metadata::get_class(this_02,(ulong)uVar2);
      pmVar3 = std::__detail::
               _Map_base<const_r_comp::Class_*,_std::pair<const_r_comp::Class_*const,_unsigned_short>,_std::allocator<std::pair<const_r_comp::Class_*const,_unsigned_short>_>,_std::__detail::_Select1st,_std::equal_to<const_r_comp::Class_*>,_std::hash<const_r_comp::Class_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
               ::operator[]((_Map_base<const_r_comp::Class_*,_std::pair<const_r_comp::Class_*const,_unsigned_short>,_std::allocator<std::pair<const_r_comp::Class_*const,_unsigned_short>_>,_std::__detail::_Select1st,_std::equal_to<const_r_comp::Class_*>,_std::hash<const_r_comp::Class_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                             *)&local_68,&local_c8);
      uVar2 = *pmVar3;
      pmVar3 = std::__detail::
               _Map_base<const_r_comp::Class_*,_std::pair<const_r_comp::Class_*const,_unsigned_short>,_std::allocator<std::pair<const_r_comp::Class_*const,_unsigned_short>_>,_std::__detail::_Select1st,_std::equal_to<const_r_comp::Class_*>,_std::hash<const_r_comp::Class_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
               ::operator[]((_Map_base<const_r_comp::Class_*,_std::pair<const_r_comp::Class_*const,_unsigned_short>,_std::allocator<std::pair<const_r_comp::Class_*const,_unsigned_short>_>,_std::__detail::_Select1st,_std::equal_to<const_r_comp::Class_*>,_std::hash<const_r_comp::Class_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                             *)&local_68,&local_c8);
      *pmVar3 = uVar2 + 1;
      std::__cxx11::string::_M_assign((string *)local_a8);
      std::__cxx11::to_string(&local_88,(uint)uVar2);
      std::__cxx11::string::append((string *)local_a8);
      std::__cxx11::string::~string((string *)&local_88);
    }
    else {
      std::__cxx11::string::_M_assign((string *)local_a8);
      local_88._M_dataplus._M_p._0_2_ = *(undefined2 *)__k;
      std::__detail::
      _Insert<unsigned_short,_unsigned_short,_std::allocator<unsigned_short>,_std::__detail::_Identity,_std::equal_to<unsigned_short>,_std::hash<unsigned_short>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>,_true>
      ::insert(local_c0,(value_type *)&local_88);
    }
    pmVar6 = std::__detail::
             _Map_base<unsigned_short,_std::pair<const_unsigned_short,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_unsigned_short,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_short>,_std::hash<unsigned_short>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
             ::operator[]((_Map_base<unsigned_short,_std::pair<const_unsigned_short,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_unsigned_short,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_short>,_std::hash<unsigned_short>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                           *)this_00,&local_d2);
    std::__cxx11::string::_M_assign((string *)pmVar6);
    uVar2 = local_d2;
    pmVar7 = std::__detail::
             _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_short>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_short>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
             ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_short>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_short>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                           *)this_01,(key_type *)local_a8);
    *pmVar7 = uVar2;
    local_d2 = local_d2 + 1;
  }
  local_d0->closing_set = false;
  std::__cxx11::string::~string((string *)local_a8);
  std::
  _Hashtable<const_r_comp::Class_*,_std::pair<const_r_comp::Class_*const,_unsigned_short>,_std::allocator<std::pair<const_r_comp::Class_*const,_unsigned_short>_>,_std::__detail::_Select1st,_std::equal_to<const_r_comp::Class_*>,_std::hash<const_r_comp::Class_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::~_Hashtable(&local_68);
  return uVar9;
}

Assistant:

uint64_t Decompiler::decompile_references(r_comp::Image *image)
{
    std::unordered_map<const Class *, uint16_t> object_ID_per_class;

    for (const std::pair<const std::string, Class> &c : metadata->sys_classes) {
        object_ID_per_class[&c.second] = 0;
    }

    std::string name;
    this->image = image;
    // populate object names first so they can be referenced in any order.
    Class *c;
    uint16_t last_object_ID;

    for (uint16_t i = 0; i < image->code_segment.objects.size(); ++i) {
        SysObject *sys_object = (SysObject *)image->code_segment.objects[i];
        const auto iterator = image->object_names.symbols.find(sys_object->oid);

        if (iterator != image->object_names.symbols.end()) {
            name = iterator->second;
            named_objects.insert(sys_object->oid);
        } else {
            c = metadata->get_class(sys_object->code[0].asOpcode());
            last_object_ID = object_ID_per_class[c];
            object_ID_per_class[c] = last_object_ID + 1;
            name = c->str_opcode;
            name += std::to_string(last_object_ID);
        }

        object_names[i] = name;
        object_indices[name] = i;
    }

    closing_set = false;
    return image->code_segment.objects.size();
}